

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::DefinitionSymbol::DefinitionSymbol
          (DefinitionSymbol *this,Scope *scope,LookupLocation lookupLocation,
          ModuleDeclarationSyntax *syntax,NetType *defaultNetType,UnconnectedDrive unconnectedDrive,
          bool cellDefine,optional<slang::TimeScale> directiveTimeScale,SyntaxTree *syntaxTree)

{
  flat_hash_set<std::string_view> *this_00;
  pointer ppMVar1;
  group_type_pointer pgVar2;
  SyntaxKind SVar3;
  PortListSyntax *pPVar4;
  ParameterPortListSyntax *syntax_00;
  TimeUnitsDeclarationSyntax *syntax_01;
  group_type_pointer pgVar5;
  value_type_pointer pbVar6;
  ulong uVar7;
  int iVar8;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  Token token;
  _Storage<slang::ast::VariableLifetime,_true> _Var9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  byte bVar13;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  optional<slang::SourceRange> unitsRange_00;
  optional<slang::SourceRange> precisionRange_00;
  byte bVar14;
  DefinitionKind DVar15;
  uint uVar16;
  SourceLocation SVar17;
  SourceLibrary *pSVar18;
  optional<slang::ast::VariableLifetime> oVar19;
  SyntaxNode *pSVar20;
  Diagnostic *this_01;
  ModportItemSyntax *pMVar21;
  uint64_t hash;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong pos0;
  ModuleHeaderSyntax *pMVar25;
  pointer ppMVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  string_view sVar30;
  SourceRange sourceRange;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffec0;
  string_view local_f0;
  iterator __begin4;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  locator local_48;
  
  sVar30 = parsing::Token::valueText(&((syntax->header).ptr)->name);
  SVar17 = parsing::Token::location(&((syntax->header).ptr)->name);
  (this->super_Symbol).kind = Definition;
  (this->super_Symbol).name = sVar30;
  (this->super_Symbol).location = SVar17;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  this->defaultNetType = defaultNetType;
  this->unconnectedDrive = unconnectedDrive;
  this->cellDefine = cellDefine;
  (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  (this->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_ =
       (pointer)(this->parameters).
                super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.firstElement;
  (this->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len = 0;
  (this->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.cap = 8;
  this_00 = &this->modports;
  boost::unordered::
  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::unordered_flat_set(this_00);
  (this->bindDirectives).
  super__Vector_base<slang::ast::BindDirectiveInfo,_std::allocator<slang::ast::BindDirectiveInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bindDirectives).
  super__Vector_base<slang::ast::BindDirectiveInfo,_std::allocator<slang::ast::BindDirectiveInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bindDirectives).
  super__Vector_base<slang::ast::BindDirectiveInfo,_std::allocator<slang::ast::BindDirectiveInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->syntaxTree = syntaxTree;
  if ((syntaxTree == (SyntaxTree *)0x0) ||
     (pSVar18 = syntaxTree->library, pSVar18 == (SourceLibrary *)0x0)) {
    pSVar18 = scope->compilation->defaultLibPtr;
  }
  this->sourceLibrary = pSVar18;
  this->instanceCount = 0;
  (this->super_Symbol).parentScope = scope;
  (this->super_Symbol).indexInScope = lookupLocation.index;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_02._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_02._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_02);
  DVar15 = SemanticFacts::getDefinitionKind((syntax->super_MemberSyntax).super_SyntaxNode.kind);
  this->definitionKind = DVar15;
  pMVar25 = (syntax->header).ptr;
  token.kind = (pMVar25->lifetime).kind;
  token._2_1_ = (pMVar25->lifetime).field_0x2;
  token.numFlags.raw = (pMVar25->lifetime).numFlags.raw;
  token.rawLen = (pMVar25->lifetime).rawLen;
  token.info = (pMVar25->lifetime).info;
  oVar19 = SemanticFacts::getVariableLifetime(token);
  _Var9._M_value = Static;
  if (((ulong)oVar19.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::VariableLifetime> >> 0x20 & 1) != 0) {
    _Var9._M_value =
         oVar19.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::VariableLifetime>._M_payload;
  }
  this->defaultLifetime = (VariableLifetime)_Var9;
  pMVar25 = (syntax->header).ptr;
  if ((pMVar25->ports != (PortListSyntax *)0x0) &&
     ((pMVar25->ports->super_SyntaxNode).kind == WildcardPortList)) {
    pSVar20 = Compilation::getExternDefinition(scope->compilation,(this->super_Symbol).name,scope);
    if ((pSVar20 == (SyntaxNode *)0x0) || (pSVar20->kind != ExternModuleDecl)) {
      if ((this->super_Symbol).name._M_len != 0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange(&pMVar25->ports->super_SyntaxNode);
        this_01 = Scope::addDiag(scope,(DiagCode)0x7d0006,sourceRange);
        Diagnostic::operator<<(this_01,(this->super_Symbol).name);
      }
    }
    else {
      pMVar25 = (ModuleHeaderSyntax *)pSVar20[6].parent;
    }
  }
  pPVar4 = pMVar25->ports;
  this->portList = pPVar4;
  if (pPVar4 == (PortListSyntax *)0x0) {
    bVar27 = false;
  }
  else {
    bVar27 = (pPVar4->super_SyntaxNode).kind == NonAnsiPortList;
  }
  this->hasNonAnsiPorts = bVar27;
  syntax_00 = pMVar25->parameters;
  if (syntax_00 != (ParameterPortListSyntax *)0x0) {
    ParameterBuilder::createDecls
              (scope,syntax_00,
               &(this->parameters).
                super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>);
  }
  unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
  precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
  ppMVar26 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
             _M_ptr;
  ppMVar1 = ppMVar26 +
            (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            _M_extent._M_extent_value;
  bVar27 = true;
  do {
    if (ppMVar26 == ppMVar1) {
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ =
           precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._17_7_;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged =
           precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_engaged;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ =
           unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._17_7_;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged =
           unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_engaged;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      SemanticFacts::populateTimeScale
                (&this->timeScale,scope,directiveTimeScale,unitsRange_00,precisionRange_00);
      return;
    }
    syntax_01 = (TimeUnitsDeclarationSyntax *)*ppMVar26;
    SVar3 = (syntax_01->super_MemberSyntax).super_SyntaxNode.kind;
    if (SVar3 == ModportDeclaration) {
      __begin4.index = 0;
      pSVar20 = syntax_01[1].super_MemberSyntax.super_SyntaxNode.parent;
      __begin4.list = (ParentList *)&syntax_01->time;
      for (; (__begin4.list != (ParentList *)&syntax_01->time ||
             (__begin4.index != (ulong)((long)&pSVar20->kind + 1) >> 1));
          __begin4.index = __begin4.index + 1) {
        pMVar21 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::
                  iterator_base<slang::syntax::ModportItemSyntax_*>::dereference(&__begin4);
        local_f0 = parsing::Token::valueText(&pMVar21->name);
        hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          this_00,&local_f0);
        pos0 = hash >> ((byte)(this_00->table_).
                              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                              .arrays.groups_size_index & 0x3f);
        lVar23 = (hash & 0xff) * 4;
        uVar10 = (&UNK_007e24cc)[lVar23];
        uVar11 = (&UNK_007e24cd)[lVar23];
        uVar12 = (&UNK_007e24ce)[lVar23];
        bVar13 = (&UNK_007e24cf)[lVar23];
        uVar22 = 0;
        uVar24 = pos0;
        do {
          pgVar5 = (this->modports).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                   .arrays.groups_;
          pgVar2 = pgVar5 + uVar24;
          bVar14 = pgVar2->m[0xf].n;
          auVar29[0] = -(pgVar2->m[0].n == uVar10);
          auVar29[1] = -(pgVar2->m[1].n == uVar11);
          auVar29[2] = -(pgVar2->m[2].n == uVar12);
          auVar29[3] = -(pgVar2->m[3].n == bVar13);
          auVar29[4] = -(pgVar2->m[4].n == uVar10);
          auVar29[5] = -(pgVar2->m[5].n == uVar11);
          auVar29[6] = -(pgVar2->m[6].n == uVar12);
          auVar29[7] = -(pgVar2->m[7].n == bVar13);
          auVar29[8] = -(pgVar2->m[8].n == uVar10);
          auVar29[9] = -(pgVar2->m[9].n == uVar11);
          auVar29[10] = -(pgVar2->m[10].n == uVar12);
          auVar29[0xb] = -(pgVar2->m[0xb].n == bVar13);
          auVar29[0xc] = -(pgVar2->m[0xc].n == uVar10);
          auVar29[0xd] = -(pgVar2->m[0xd].n == uVar11);
          auVar29[0xe] = -(pgVar2->m[0xe].n == uVar12);
          auVar29[0xf] = -(bVar14 == bVar13);
          uVar16 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe);
          if (uVar16 != 0) {
            pbVar6 = (this->modports).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                     .arrays.elements_;
            do {
              iVar8 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
                }
              }
              bVar27 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)this_00,&local_f0,
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  ((long)&pbVar6[uVar24 * 0xf]._M_len + (ulong)(uint)(iVar8 << 4)));
              if (bVar27) goto LAB_0064d9ae;
              uVar16 = uVar16 - 1 & uVar16;
            } while (uVar16 != 0);
            bVar14 = pgVar5[uVar24].m[0xf].n;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar14) == 0) break;
          uVar7 = (this->modports).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                  .arrays.groups_size_mask;
          lVar23 = uVar24 + uVar22;
          uVar22 = uVar22 + 1;
          uVar24 = lVar23 + 1U & uVar7;
        } while (uVar22 <= uVar7);
        if ((this->modports).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .size_ctrl.size <
            (this->modports).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                    (&local_48,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)this_00,pos0,hash,&local_f0);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                    (&local_48,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)this_00,hash,&local_f0);
        }
LAB_0064d9ae:
      }
LAB_0064d9f6:
      bVar27 = false;
    }
    else if (SVar3 == ParameterDeclarationStatement) {
      bVar28 = true;
      if (syntax_00 == (ParameterPortListSyntax *)0x0) {
        bVar28 = *(short *)&(*(Scope **)&syntax_01->keyword)->firstMember == 0xd2;
      }
      bVar27 = false;
      attributes._M_extent._M_extent_value = in_stack_fffffffffffffec0._M_extent_value;
      attributes._M_ptr = (pointer)&this->parameters;
      ParameterBuilder::createDecls
                ((ParameterBuilder *)scope,*(Scope **)&syntax_01->keyword,
                 (ParameterDeclarationBaseSyntax *)(ulong)bVar28,false,
                 SUB81((syntax_01->super_MemberSyntax).attributes.
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       _M_ptr,0),attributes,
                 (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)
                 (syntax_01->super_MemberSyntax).attributes.
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                 _M_extent._M_extent_value);
    }
    else {
      if (SVar3 != TimeUnitsDeclaration) goto LAB_0064d9f6;
      if ((this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
        (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_payload =
             (_Storage<slang::TimeScale,_true>)0x1030103;
        (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
      }
      SemanticFacts::populateTimeScale
                ((TimeScale *)&this->timeScale,scope,syntax_01,&unitsRange,&precisionRange,bVar27);
    }
    ppMVar26 = ppMVar26 + 1;
  } while( true );
}

Assistant:

DefinitionSymbol::DefinitionSymbol(const Scope& scope, LookupLocation lookupLocation,
                                   const ModuleDeclarationSyntax& syntax,
                                   const NetType& defaultNetType, UnconnectedDrive unconnectedDrive,
                                   bool cellDefine, std::optional<TimeScale> directiveTimeScale,
                                   const SyntaxTree* syntaxTree) :
    Symbol(SymbolKind::Definition, syntax.header->name.valueText(), syntax.header->name.location()),
    defaultNetType(defaultNetType), unconnectedDrive(unconnectedDrive), cellDefine(cellDefine),
    syntaxTree(syntaxTree), sourceLibrary(getLibForDef(scope, syntaxTree)) {

    // Extract and save various properties of the definition.
    setParent(scope, lookupLocation.getIndex());
    setSyntax(syntax);
    setAttributes(scope, syntax.attributes);

    definitionKind = SemanticFacts::getDefinitionKind(syntax.kind);
    defaultLifetime = SemanticFacts::getVariableLifetime(syntax.header->lifetime)
                          .value_or(VariableLifetime::Static);

    auto header = syntax.header.get();
    if (header->ports && header->ports->kind == SyntaxKind::WildcardPortList) {
        auto& comp = scope.getCompilation();
        auto externMod = comp.getExternDefinition(name, scope);
        if (externMod && externMod->kind == SyntaxKind::ExternModuleDecl)
            header = externMod->as<ExternModuleDeclSyntax>().header;
        else if (!name.empty())
            scope.addDiag(diag::MissingExternWildcardPorts, header->ports->sourceRange()) << name;
    }

    portList = header->ports;
    hasNonAnsiPorts = portList && portList->kind == SyntaxKind::NonAnsiPortList;

    // Find all port parameters.
    bool hasPortParams = header->parameters != nullptr;
    if (hasPortParams)
        ParameterBuilder::createDecls(scope, *header->parameters, parameters);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            if (!timeScale)
                timeScale.emplace();

            SemanticFacts::populateTimeScale(*timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;
        if (member->kind == SyntaxKind::ModportDeclaration) {
            for (auto item : member->as<ModportDeclarationSyntax>().items)
                modports.emplace(item->name.valueText());
        }
        else if (member->kind == SyntaxKind::ParameterDeclarationStatement) {
            auto declaration = member->as<ParameterDeclarationStatementSyntax>().parameter;
            bool isLocal = hasPortParams ||
                           declaration->keyword.kind == TokenKind::LocalParamKeyword;

            ParameterBuilder::createDecls(scope, *declaration, isLocal, /* isPort */ false,
                                          member->attributes, parameters);
        }
    }

    SemanticFacts::populateTimeScale(timeScale, scope, directiveTimeScale, unitsRange,
                                     precisionRange);
}